

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_wd_leaflist_cleanup(ly_set *set,unres_data *unres)

{
  uint local_1c;
  uint i;
  unres_data *unres_local;
  ly_set *set_local;
  
  if (set != (ly_set *)0x0) {
    local_1c = 0;
    while ((local_1c < set->number && (((ulong)(set->set).s[local_1c]->dsc & 0x100) != 0))) {
      local_1c = local_1c + 1;
    }
    if (local_1c < set->number) {
      for (local_1c = 0; local_1c < set->number; local_1c = local_1c + 1) {
        if (((ulong)(set->set).s[local_1c]->dsc & 0x100) != 0) {
          if (unres->store_diff == 0) {
            lyd_free((lyd_node *)(set->set).s[local_1c]);
          }
          else {
            unres_data_diff_new(unres,(lyd_node *)(set->set).s[local_1c],
                                (lyd_node *)(set->set).s[local_1c]->iffeature,0);
            lyd_unlink((lyd_node *)(set->set).s[local_1c]);
          }
        }
      }
    }
    return;
  }
  __assert_fail("set",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                ,0x1c22,"void lyd_wd_leaflist_cleanup(struct ly_set *, struct unres_data *)");
}

Assistant:

static void
lyd_wd_leaflist_cleanup(struct ly_set *set, struct unres_data *unres)
{
    unsigned int i;

    assert(set);

    /* if there is an instance without the dflt flag, we have to
     * remove all instances with the flag - an instance could be
     * explicitely added, so the default leaflists were invalidated */
    for (i = 0; i < set->number; i++) {
        if (!set->set.d[i]->dflt) {
            break;
        }
    }
    if (i < set->number) {
        for (i = 0; i < set->number; i++) {
            if (set->set.d[i]->dflt) {
                /* remove this default instance */
                if (unres->store_diff) {
                    /* just move it to diff if is being generated */
                    unres_data_diff_new(unres, set->set.d[i], set->set.d[i]->parent, 0);
                    lyd_unlink(set->set.d[i]);
                } else {
                    lyd_free(set->set.d[i]);
                }
            }
        }
    }
}